

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O2

int IsRegister(char *zeexpression)

{
  int iVar1;
  char *__s2;
  bool bVar2;
  
  iVar1 = GetCRC(zeexpression);
  bVar2 = false;
  switch(iVar1) {
  case 0x7a98a6b9:
    if (*zeexpression == 'A') {
LAB_00110ebf:
      bVar2 = zeexpression[1] == '\0';
      goto switchD_00110e5a_caseD_7a98a6bf;
    }
    break;
  case 0x7a98a6ba:
    if (*zeexpression == 'B') goto LAB_00110ebf;
    break;
  case 0x7a98a6bb:
    if (*zeexpression == 'C') goto LAB_00110ebf;
    break;
  case 0x7a98a6bc:
    if (*zeexpression == 'D') goto LAB_00110ebf;
    break;
  case 0x7a98a6bd:
    if (*zeexpression == 'E') goto LAB_00110ebf;
    break;
  case 0x7a98a6be:
    if (*zeexpression == 'F') goto LAB_00110ebf;
    break;
  case 0x7a98a6bf:
  case 0x7a98a6c2:
  case 0x7a98a6c3:
  case 0x7a98a6c5:
  case 0x7a98a6c6:
  case 0x7a98a6c7:
  case 0x7a98a6c8:
  case 0x7a98a6c9:
    goto switchD_00110e5a_caseD_7a98a6bf;
  case 0x7a98a6c0:
    if (*zeexpression == 'H') goto LAB_00110ebf;
    break;
  case 0x7a98a6c1:
    if (*zeexpression == 'I') goto LAB_00110ebf;
    break;
  case 0x7a98a6c4:
    if (*zeexpression == 'L') goto LAB_00110ebf;
    break;
  case 0x7a98a6ca:
    if (*zeexpression == 'R') goto LAB_00110ebf;
    break;
  default:
    if (iVar1 == -0x1e60ee9e) {
      __s2 = "IYH";
    }
    else if (iVar1 == -0x1e60ee9a) {
      __s2 = "IYL";
    }
    else if (iVar1 == -0x1e60e89f) {
      __s2 = "IXH";
    }
    else {
      if (iVar1 != -0x1e60e89b) {
        if (iVar1 == 0x4bd50519) {
          if (*zeexpression == 'Y') {
LAB_00110f58:
            if (zeexpression[1] == 'H') goto LAB_00110f88;
          }
        }
        else if (iVar1 == 0x4bd5051d) {
          if (*zeexpression == 'Y') {
LAB_00110f13:
            if (zeexpression[1] == 'L') goto LAB_00110f88;
          }
        }
        else if (iVar1 == 0x4bd50718) {
          if (*zeexpression == 'X') goto LAB_00110f58;
        }
        else if (iVar1 == 0x4bd5071c) {
          if (*zeexpression == 'X') goto LAB_00110f13;
        }
        else if (iVar1 == 0x4bd52519) {
          if (*zeexpression == 'I') goto LAB_00110f82;
        }
        else if (iVar1 == 0x4bd5251a) {
          if (*zeexpression == 'I') goto LAB_00110f75;
        }
        else if (iVar1 == 0x4bd5270c) {
          if (*zeexpression == 'H') goto LAB_00110f13;
        }
        else if (iVar1 == 0x4bd52718) {
          if (*zeexpression == 'H') {
LAB_00110f82:
            if (zeexpression[1] == 'X') goto LAB_00110f88;
          }
        }
        else if (iVar1 == 0x4bd52719) {
          if (*zeexpression == 'H') {
LAB_00110f75:
            if (zeexpression[1] == 'Y') goto LAB_00110f88;
          }
        }
        else if (iVar1 == 0x4bd52f1c) {
          if (*zeexpression == 'L') goto LAB_00110f82;
        }
        else if (iVar1 == 0x4bd52f1d) {
          if (*zeexpression == 'L') goto LAB_00110f75;
        }
        else if (iVar1 == 0x4bd5311b) {
          if ((*zeexpression == 'S') && (zeexpression[1] == 'P')) {
LAB_00110f88:
            bVar2 = zeexpression[2] == '\0';
            goto switchD_00110e5a_caseD_7a98a6bf;
          }
        }
        else if (iVar1 == 0x4bd5d2fd) {
          if ((*zeexpression == 'B') && (zeexpression[1] == 'C')) goto LAB_00110f88;
        }
        else if (iVar1 == 0x4bd5d4ff) {
          if ((*zeexpression == 'A') && (zeexpression[1] == 'F')) goto LAB_00110f88;
        }
        else {
          bVar2 = false;
          if (iVar1 != 0x4bd5df01) goto switchD_00110e5a_caseD_7a98a6bf;
          if ((*zeexpression == 'D') && (zeexpression[1] == 'E')) goto LAB_00110f88;
        }
        break;
      }
      __s2 = "IXL";
    }
    iVar1 = strcmp(zeexpression,__s2);
    bVar2 = iVar1 == 0;
    goto switchD_00110e5a_caseD_7a98a6bf;
  }
  bVar2 = false;
switchD_00110e5a_caseD_7a98a6bf:
  return (int)bVar2;
}

Assistant:

int IsRegister(char *zeexpression)
{
	#undef FUNC
	#define FUNC "IsRegister"

	switch (GetCRC(zeexpression)) {
		case CRC_F:if (strcmp(zeexpression,"F")==0) return 1; else return 0;
		case CRC_I:if (strcmp(zeexpression,"I")==0) return 1; else return 0;
		case CRC_R:if (strcmp(zeexpression,"R")==0) return 1; else return 0;
		case CRC_A:if (strcmp(zeexpression,"A")==0) return 1; else return 0;
		case CRC_B:if (strcmp(zeexpression,"B")==0) return 1; else return 0;
		case CRC_C:if (strcmp(zeexpression,"C")==0) return 1; else return 0;
		case CRC_D:if (strcmp(zeexpression,"D")==0) return 1; else return 0;
		case CRC_E:if (strcmp(zeexpression,"E")==0) return 1; else return 0;
		case CRC_H:if (strcmp(zeexpression,"H")==0) return 1; else return 0;
		case CRC_L:if (strcmp(zeexpression,"L")==0) return 1; else return 0;
		case CRC_BC:if (strcmp(zeexpression,"BC")==0) return 1; else return 0;
		case CRC_DE:if (strcmp(zeexpression,"DE")==0) return 1; else return 0;
		case CRC_HL:if (strcmp(zeexpression,"HL")==0) return 1; else return 0;
		case CRC_IX:if (strcmp(zeexpression,"IX")==0) return 1; else return 0;
		case CRC_IY:if (strcmp(zeexpression,"IY")==0) return 1; else return 0;
		case CRC_SP:if (strcmp(zeexpression,"SP")==0) return 1; else return 0;
		case CRC_AF:if (strcmp(zeexpression,"AF")==0) return 1; else return 0;
		case CRC_XH:if (strcmp(zeexpression,"XH")==0) return 1; else return 0;
		case CRC_XL:if (strcmp(zeexpression,"XL")==0) return 1; else return 0;
		case CRC_YH:if (strcmp(zeexpression,"YH")==0) return 1; else return 0;
		case CRC_YL:if (strcmp(zeexpression,"YL")==0) return 1; else return 0;
		case CRC_HX:if (strcmp(zeexpression,"HX")==0) return 1; else return 0;
		case CRC_LX:if (strcmp(zeexpression,"LX")==0) return 1; else return 0;
		case CRC_HY:if (strcmp(zeexpression,"HY")==0) return 1; else return 0;
		case CRC_LY:if (strcmp(zeexpression,"LY")==0) return 1; else return 0;
		case CRC_IXL:if (strcmp(zeexpression,"IXL")==0) return 1; else return 0;
		case CRC_IXH:if (strcmp(zeexpression,"IXH")==0) return 1; else return 0;
		case CRC_IYL:if (strcmp(zeexpression,"IYL")==0) return 1; else return 0;
		case CRC_IYH:if (strcmp(zeexpression,"IYH")==0) return 1; else return 0;
		default:break;
	}
	return 0;
}